

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcRoot::IfcRoot(IfcRoot *this,void **vtt)

{
  _func_int **pp_Var1;
  
  pp_Var1 = (_func_int **)vtt[1];
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>)._vptr_ObjectHelper = pp_Var1;
  *(void **)((long)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>).
                    _vptr_ObjectHelper + (long)pp_Var1[-3]) = vtt[2];
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>).aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  pp_Var1 = (_func_int **)*vtt;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>)._vptr_ObjectHelper = pp_Var1;
  *(void **)((long)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>).
                    _vptr_ObjectHelper + (long)pp_Var1[-3]) = vtt[3];
  *(undefined1 **)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>).field_0x10 =
       &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>).field_0x20;
  *(undefined8 *)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>).field_0x18 = 0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>).field_0x20 = 0;
  (this->OwnerHistory).obj = (LazyObject *)0x0;
  (this->Name).ptr._M_dataplus._M_p = (pointer)&(this->Name).ptr.field_2;
  (this->Name).ptr._M_string_length = 0;
  (this->Name).ptr.field_2._M_local_buf[0] = '\0';
  (this->Name).have = false;
  (this->Description).ptr._M_dataplus._M_p = (pointer)&(this->Description).ptr.field_2;
  (this->Description).ptr._M_string_length = 0;
  (this->Description).ptr.field_2._M_local_buf[0] = '\0';
  (this->Description).have = false;
  return;
}

Assistant:

ObjectHelper()
        : aux_is_derived(0) {
            // empty
        }